

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O0

void despot::AEMS::FindMaxApproxErrorLeaf
               (QNode *qnode,double likelihood,double *bestAE,VNode **bestNode)

{
  bool bVar1;
  pointer ppVar2;
  double dVar3;
  VNode *vnode;
  _Self local_38;
  iterator it;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *children;
  VNode **bestNode_local;
  double *bestAE_local;
  double likelihood_local;
  QNode *qnode_local;
  
  dVar3 = Likelihood(qnode);
  it._M_node = (_Base_ptr)QNode::children(qnode);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
       ::begin((map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                *)it._M_node);
  while( true ) {
    vnode = (VNode *)std::
                     map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                     ::end((map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                            *)it._M_node);
    bVar1 = std::operator!=(&local_38,(_Self *)&vnode);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator->
                       (&local_38);
    FindMaxApproxErrorLeaf(ppVar2->second,dVar3 * likelihood,bestAE,bestNode);
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator++
              (&local_38,0);
  }
  return;
}

Assistant:

void AEMS::FindMaxApproxErrorLeaf(QNode* qnode, double likelihood,
	double& bestAE, VNode*& bestNode) {
	likelihood *= Likelihood(qnode);

	map<OBS_TYPE, VNode*>& children = qnode->children();
	for (map<OBS_TYPE, VNode*>::iterator it = children.begin();
			it != children.end(); it++) {
		VNode* vnode = it->second;
		FindMaxApproxErrorLeaf(vnode, likelihood, bestAE, bestNode);
	}
}